

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PoslistFilterCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint local_40;
  uint local_3c;
  int iCol_1;
  int iCol;
  int iStart;
  int i;
  PoslistCallbackCtx *pCtx;
  u8 *puStack_20;
  int nChunk_local;
  u8 *pChunk_local;
  void *pContext_local;
  Fts5Index *pUnused_local;
  
  if (0 < nChunk) {
    iCol = 0;
    iCol_1 = 0;
    pContext_local = pUnused;
    pChunk_local = (u8 *)pContext;
    puStack_20 = pChunk;
    pCtx._4_4_ = nChunk;
    _iStart = (long *)pContext;
    if (*(int *)((long)pContext + 0x10) == 2) {
      iCol = 1;
      local_3c = (uint)*pChunk;
      if ((*pChunk & 0x80) != 0) {
        iCol = 0;
        iVar2 = sqlite3Fts5GetVarint32(pChunk,&local_3c);
        iCol = iVar2 + iCol;
      }
      iVar2 = fts5IndexColsetTest((Fts5Colset *)_iStart[1],local_3c);
      if (iVar2 == 0) {
        *(undefined4 *)(_iStart + 2) = 0;
      }
      else {
        *(undefined4 *)(_iStart + 2) = 1;
        iVar2 = sqlite3Fts5PutVarint((uchar *)(*(long *)*_iStart + (long)*(int *)(*_iStart + 8)),1);
        *(int *)(*_iStart + 8) = iVar2 + *(int *)(*_iStart + 8);
      }
    }
    do {
      while( true ) {
        bVar3 = false;
        if (iCol < pCtx._4_4_) {
          bVar3 = puStack_20[iCol] != '\x01';
        }
        if (!bVar3) break;
        while ((puStack_20[iCol] & 0x80) != 0) {
          iCol = iCol + 1;
        }
        iCol = iCol + 1;
      }
      if ((int)_iStart[2] != 0) {
        memcpy((void *)(*(long *)*_iStart + (long)*(int *)(*_iStart + 8)),puStack_20 + iCol_1,
               (long)(iCol - iCol_1));
        *(int *)(*_iStart + 8) = (iCol - iCol_1) + *(int *)(*_iStart + 8);
      }
      if (iCol < pCtx._4_4_) {
        iCol_1 = iCol;
        iVar2 = iCol + 1;
        if (iVar2 < pCtx._4_4_) {
          local_40 = (uint)puStack_20[iVar2];
          iVar1 = iCol + 2;
          if ((puStack_20[iVar2] & 0x80) != 0) {
            iCol = iCol + 1;
            iVar2 = sqlite3Fts5GetVarint32(puStack_20 + iCol,&local_40);
            iVar1 = iVar2 + iCol;
          }
          iCol = iVar1;
          iVar2 = fts5IndexColsetTest((Fts5Colset *)_iStart[1],local_40);
          *(int *)(_iStart + 2) = iVar2;
          if ((int)_iStart[2] != 0) {
            memcpy((void *)(*(long *)*_iStart + (long)*(int *)(*_iStart + 8)),puStack_20 + iCol_1,
                   (long)(iCol - iCol_1));
            *(int *)(*_iStart + 8) = (iCol - iCol_1) + *(int *)(*_iStart + 8);
            iCol_1 = iCol;
          }
        }
        else {
          *(undefined4 *)(_iStart + 2) = 2;
          iCol = iVar2;
        }
      }
    } while (iCol < pCtx._4_4_);
  }
  return;
}

Assistant:

static void fts5PoslistFilterCallback(
  Fts5Index *pUnused,
  void *pContext, 
  const u8 *pChunk, int nChunk
){
  PoslistCallbackCtx *pCtx = (PoslistCallbackCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    /* Search through to find the first varint with value 1. This is the
    ** start of the next columns hits. */
    int i = 0;
    int iStart = 0;

    if( pCtx->eState==2 ){
      int iCol;
      fts5FastGetVarint32(pChunk, i, iCol);
      if( fts5IndexColsetTest(pCtx->pColset, iCol) ){
        pCtx->eState = 1;
        fts5BufferSafeAppendVarint(pCtx->pBuf, 1);
      }else{
        pCtx->eState = 0;
      }
    }

    do {
      while( i<nChunk && pChunk[i]!=0x01 ){
        while( pChunk[i] & 0x80 ) i++;
        i++;
      }
      if( pCtx->eState ){
        fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
      }
      if( i<nChunk ){
        int iCol;
        iStart = i;
        i++;
        if( i>=nChunk ){
          pCtx->eState = 2;
        }else{
          fts5FastGetVarint32(pChunk, i, iCol);
          pCtx->eState = fts5IndexColsetTest(pCtx->pColset, iCol);
          if( pCtx->eState ){
            fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
            iStart = i;
          }
        }
      }
    }while( i<nChunk );
  }
}